

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase319::run(TestCase319 *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  short sVar4;
  undefined4 uVar5;
  StructDataBitCount SVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  unsigned_long uVar10;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  undefined1 local_1c8 [16];
  Builder corge;
  Builder group;
  unsigned_long local_150;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestInterleavedGroups>
            (&root,&builder.super_MessageBuilder);
  group._builder.data = root._builder.data;
  group._builder.pointers = root._builder.pointers;
  group._builder.dataSize = root._builder.dataSize;
  group._builder.pointerCount = root._builder.pointerCount;
  group._builder._38_2_ = root._builder._38_2_;
  group._builder.segment = root._builder.segment;
  group._builder.capTable = root._builder.capTable;
  *(undefined4 *)root._builder.data = 0xbc614e;
  *(undefined8 *)((long)root._builder.data + 8) = 0x7048860ddf79;
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::initCorge(&corge,&group);
  *(undefined8 *)((long)corge._builder.data + 0x20) = 0x3824430f8500d;
  *(undefined2 *)((long)corge._builder.data + 0x18) = 0x3039;
  value.super_StringPtr.content.size_ = 6;
  value.super_StringPtr.content.ptr = "plugh";
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Builder::setPlugh(&corge,value)
  ;
  value_00.super_StringPtr.content.size_ = 6;
  value_00.super_StringPtr.content.ptr = "xyzzy";
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Builder::setXyzzy
            (&corge,value_00);
  value_01.super_StringPtr.content.size_ = 6;
  value_01.super_StringPtr.content.ptr = "waldo";
  capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::setWaldo(&group,value_01);
  group._builder.data = root._builder.data;
  group._builder.pointers = root._builder.pointers;
  group._builder.dataSize = root._builder.dataSize;
  group._builder.pointerCount = root._builder.pointerCount;
  group._builder._38_2_ = root._builder._38_2_;
  group._builder.segment = root._builder.segment;
  group._builder.capTable = root._builder.capTable;
  *(undefined4 *)((long)root._builder.data + 4) = 0x165ec15;
  *(undefined8 *)((long)root._builder.data + 0x10) = 0xd55697c43ac0;
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::initCorge
            ((Builder *)&corge,(Builder *)&group);
  *(undefined8 *)((long)corge._builder.data + 0x28) = 0x31d361eb8a086;
  *(undefined2 *)((long)corge._builder.data + 0x1a) = 0x5ba0;
  value_02.super_StringPtr.content.size_ = 6;
  value_02.super_StringPtr.content.ptr = "hgulp";
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Builder::setPlugh
            ((Builder *)&corge,value_02);
  value_03.super_StringPtr.content.size_ = 6;
  value_03.super_StringPtr.content.ptr = "yzzyx";
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Builder::setXyzzy
            ((Builder *)&corge,value_03);
  value_04.super_StringPtr.content.size_ = 6;
  value_04.super_StringPtr.content.ptr = "odlaw";
  capnproto_test::capnp::test::TestInterleavedGroups::Group2::Builder::setWaldo
            ((Builder *)&group,value_04);
  StructBuilder::asReader(&root._builder);
  group._builder.dataSize = corge._builder.dataSize;
  group._builder.pointerCount = corge._builder.pointerCount;
  group._builder._38_2_ = corge._builder._38_2_;
  uVar2 = group._builder._32_8_;
  group._builder.data = corge._builder.data;
  group._builder.pointers = corge._builder.pointers;
  group._builder.segment = corge._builder.segment;
  group._builder.capTable = corge._builder.capTable;
  group._builder.dataSize = corge._builder.dataSize;
  group._builder._32_8_ = uVar2;
  if (group._builder.dataSize < 0x20) {
    if (kj::_::Debug::minSeverity < 3) {
      uVar5 = 0;
LAB_001f9614:
      corge._builder.segment = (SegmentBuilder *)CONCAT44(corge._builder.segment._4_4_,0xbc614e);
      local_1c8._0_4_ = uVar5;
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(12345678u) == (group.getFoo())\", 12345678u, group.getFoo()"
                 ,(char (*) [49])"failed: expected (12345678u) == (group.getFoo())",(uint *)&corge,
                 (uint *)local_1c8);
      SVar6 = group._builder.dataSize;
      uVar2 = group._builder._32_8_;
      goto LAB_001f964a;
    }
  }
  else {
    SVar6 = group._builder.dataSize;
    if ((*corge._builder.data != 0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
      uVar5 = *corge._builder.data;
      goto LAB_001f9614;
    }
LAB_001f964a:
    group._builder._32_8_ = uVar2;
    if (SVar6 < 0x80) {
      if (kj::_::Debug::minSeverity < 3) {
        pcVar9 = (char *)0x0;
LAB_001f9685:
        corge._builder.segment = (SegmentBuilder *)0x7048860ddf79;
        local_1c8._0_8_ = pcVar9;
        kj::_::Debug::log<char_const(&)[58],unsigned_long_long,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x160,ERROR,
                   "\"failed: expected \" \"(123456789012345llu) == (group.getBar())\", 123456789012345llu, group.getBar()"
                   ,(char (*) [58])"failed: expected (123456789012345llu) == (group.getBar())",
                   (unsigned_long_long *)&corge,(unsigned_long *)local_1c8);
      }
    }
    else {
      pcVar9 = *(char **)((long)group._builder.data + 8);
      if ((pcVar9 != (char *)0x7048860ddf79) && (kj::_::Debug::minSeverity < 3)) goto LAB_001f9685;
    }
  }
  corge._builder.dataSize = group._builder.dataSize;
  corge._builder.pointerCount = group._builder.pointerCount;
  corge._builder._38_2_ = group._builder._38_2_;
  uVar2 = corge._builder._32_8_;
  corge._builder.data = group._builder.data;
  corge._builder.pointers = group._builder.pointers;
  corge._builder.segment = group._builder.segment;
  corge._builder.capTable = group._builder.capTable;
  corge._builder.dataSize = group._builder.dataSize;
  corge._builder._32_8_ = uVar2;
  if (corge._builder.dataSize < 0x140) {
    SVar6 = corge._builder.dataSize;
    if (kj::_::Debug::minSeverity < 3) {
      uVar10 = 0;
LAB_001f9715:
      local_1c8._0_8_ = (char *)0x3824430f8500d;
      local_150 = uVar10;
      kj::_::Debug::log<char_const(&)[61],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(987654321098765llu) == (corge.getGrault())\", 987654321098765llu, corge.getGrault()"
                 ,(char (*) [61])"failed: expected (987654321098765llu) == (corge.getGrault())",
                 (unsigned_long_long *)local_1c8,&local_150);
      SVar6 = corge._builder.dataSize;
    }
    if (0xcf < SVar6) goto LAB_001f976e;
    if (kj::_::Debug::minSeverity < 3) {
      sVar4 = 0;
      goto LAB_001f9791;
    }
  }
  else {
    uVar10 = *(unsigned_long *)((long)group._builder.data + 0x20);
    if ((uVar10 != 0x3824430f8500d) && (kj::_::Debug::minSeverity < 3)) goto LAB_001f9715;
LAB_001f976e:
    sVar4 = *(short *)((long)corge._builder.data + 0x18);
    if ((sVar4 != 0x3039) && (kj::_::Debug::minSeverity < 3)) {
LAB_001f9791:
      local_1c8._0_4_ = 0x3039;
      local_150 = CONCAT62(local_150._2_6_,sVar4);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(12345u) == (corge.getGarply())\", 12345u, corge.getGarply()"
                 ,(char (*) [49])"failed: expected (12345u) == (corge.getGarply())",
                 (uint *)local_1c8,(unsigned_short *)&local_150);
    }
  }
  local_1c8 = (undefined1  [16])
              capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getPlugh
                        ((Reader *)&corge);
  bVar3 = kj::operator==("plugh",(StringPtr *)local_1c8);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    local_1c8 = (undefined1  [16])
                capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getPlugh
                          ((Reader *)&corge);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"plugh\\\") == (corge.getPlugh())\", \"plugh\", corge.getPlugh()"
               ,(char (*) [49])"failed: expected (\"plugh\") == (corge.getPlugh())",
               (char (*) [6])"plugh",(Reader *)local_1c8);
  }
  local_1c8 = (undefined1  [16])
              capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getXyzzy
                        ((Reader *)&corge);
  bVar3 = kj::operator==("xyzzy",(StringPtr *)local_1c8);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    local_1c8 = (undefined1  [16])
                capnproto_test::capnp::test::TestInterleavedGroups::Group1::Corge::Reader::getXyzzy
                          ((Reader *)&corge);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(\\\"xyzzy\\\") == (corge.getXyzzy())\", \"xyzzy\", corge.getXyzzy()"
               ,(char (*) [49])"failed: expected (\"xyzzy\") == (corge.getXyzzy())",
               (char (*) [6])"xyzzy",(Reader *)local_1c8);
  }
  local_1c8 = (undefined1  [16])
              capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getWaldo
                        ((Reader *)&group);
  bVar3 = kj::operator==("waldo",(StringPtr *)local_1c8);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    local_1c8 = (undefined1  [16])
                capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::getWaldo
                          ((Reader *)&group);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x166,ERROR,
               "\"failed: expected \" \"(\\\"waldo\\\") == (group.getWaldo())\", \"waldo\", group.getWaldo()"
               ,(char (*) [49])"failed: expected (\"waldo\") == (group.getWaldo())",
               (char (*) [6])"waldo",(Reader *)local_1c8);
  }
  capnproto_test::capnp::test::TestInterleavedGroups::Builder::initGroup1((Builder *)&corge,&root);
  StructBuilder::asReader(&corge._builder);
  if (0x1f < group._builder.dataSize) {
    if ((*group._builder.data != 0) && (kj::_::Debug::minSeverity < 3)) {
      corge._builder.segment =
           (SegmentBuilder *)((ulong)corge._builder.segment & 0xffffffff00000000);
      local_1c8._0_4_ = *group._builder.data;
      kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"(0u) == (group.getFoo())\", 0u, group.getFoo()",
                 (char (*) [42])"failed: expected (0u) == (group.getFoo())",(uint *)&corge,
                 (uint *)local_1c8);
    }
    if (0x7f < group._builder.dataSize) {
      uVar7 = group._builder.dataSize;
      if ((*(SegmentBuilder **)((long)group._builder.data + 8) != (SegmentBuilder *)0x0) &&
         (kj::_::Debug::minSeverity < 3)) {
        auVar1._12_4_ = 0;
        auVar1._0_12_ = local_1c8._4_12_;
        local_1c8 = auVar1 << 0x20;
        corge._builder.segment = *(SegmentBuilder **)((long)group._builder.data + 8);
        kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x16d,ERROR,
                   "\"failed: expected \" \"(0u) == (group.getBar())\", 0u, group.getBar()",
                   (char (*) [42])"failed: expected (0u) == (group.getBar())",(uint *)local_1c8,
                   (unsigned_long *)&corge._builder);
        uVar7 = group._builder.dataSize;
      }
      if (uVar7 < 0xf0) {
LAB_001f9a4c:
        if (uVar7 < 0xd0) goto LAB_001f9a9c;
      }
      else if ((*(short *)((long)group._builder.data + 0x1c) != 0) &&
              (kj::_::Debug::minSeverity < 3)) {
        corge._builder.segment =
             (SegmentBuilder *)((ulong)corge._builder.segment & 0xffffffffffff0000);
        local_1c8._0_2_ = *(short *)((long)group._builder.data + 0x1c);
        kj::_::Debug::
        log<char_const(&)[79],capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which,capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x16e,ERROR,
                   "\"failed: expected \" \"(test::TestInterleavedGroups::Group1::QUX) == (group.which())\", test::TestInterleavedGroups::Group1::QUX, group.which()"
                   ,(char (*) [79])
                    "failed: expected (test::TestInterleavedGroups::Group1::QUX) == (group.which())"
                   ,(Which *)&corge,(Which *)local_1c8);
        uVar7 = group._builder.dataSize;
        goto LAB_001f9a4c;
      }
      if ((*(short *)((long)group._builder.data + 0x18) != 0) && (kj::_::Debug::minSeverity < 3)) {
        corge._builder.segment =
             (SegmentBuilder *)((ulong)corge._builder.segment & 0xffffffff00000000);
        local_1c8._0_2_ = *(short *)((long)group._builder.data + 0x18);
        kj::_::Debug::log<char_const(&)[42],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x16f,ERROR,
                   "\"failed: expected \" \"(0u) == (group.getQux())\", 0u, group.getQux()",
                   (char (*) [42])"failed: expected (0u) == (group.getQux())",(uint *)&corge,
                   (unsigned_short *)local_1c8);
      }
    }
  }
LAB_001f9a9c:
  bVar3 = capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::hasWaldo
                    ((Reader *)&group);
  if (bVar3 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x170,ERROR,"\"failed: expected \" \"!(group.hasWaldo())\"",
               (char (*) [37])"failed: expected !(group.hasWaldo())");
  }
  StructBuilder::asReader(&root._builder);
  group._builder.dataSize = corge._builder.dataSize;
  group._builder.pointerCount = corge._builder.pointerCount;
  group._builder._38_2_ = corge._builder._38_2_;
  uVar2 = group._builder._32_8_;
  group._builder.data = corge._builder.data;
  group._builder.pointers = corge._builder.pointers;
  group._builder.segment = corge._builder.segment;
  group._builder.capTable = corge._builder.capTable;
  group._builder.dataSize = corge._builder.dataSize;
  SVar6 = group._builder.dataSize;
  group._builder._32_8_ = uVar2;
  if (group._builder.dataSize < 0x40) {
    if (kj::_::Debug::minSeverity < 3) {
      iVar8 = 0;
LAB_001f9b44:
      corge._builder.segment = (SegmentBuilder *)CONCAT44(corge._builder.segment._4_4_,0x165ec15);
      local_1c8._0_4_ = iVar8;
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(23456789u) == (group.getFoo())\", 23456789u, group.getFoo()"
                 ,(char (*) [49])"failed: expected (23456789u) == (group.getFoo())",(uint *)&corge,
                 (uint *)local_1c8);
      goto LAB_001f9b73;
    }
  }
  else {
    iVar8 = *(int *)((long)corge._builder.data + 4);
    if ((iVar8 != 0x165ec15) && (kj::_::Debug::minSeverity < 3)) goto LAB_001f9b44;
LAB_001f9b73:
    if (SVar6 < 0xc0) {
      if (kj::_::Debug::minSeverity < 3) {
        pcVar9 = (char *)0x0;
LAB_001f9ba5:
        corge._builder.segment = (SegmentBuilder *)0xd55697c43ac0;
        local_1c8._0_8_ = pcVar9;
        kj::_::Debug::log<char_const(&)[58],unsigned_long_long,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x177,ERROR,
                   "\"failed: expected \" \"(234567890123456llu) == (group.getBar())\", 234567890123456llu, group.getBar()"
                   ,(char (*) [58])"failed: expected (234567890123456llu) == (group.getBar())",
                   (unsigned_long_long *)&corge,(unsigned_long *)local_1c8);
      }
    }
    else {
      pcVar9 = *(char **)((long)group._builder.data + 0x10);
      if ((pcVar9 != (char *)0xd55697c43ac0) && (kj::_::Debug::minSeverity < 3)) goto LAB_001f9ba5;
    }
  }
  corge._builder.dataSize = group._builder.dataSize;
  corge._builder.pointerCount = group._builder.pointerCount;
  corge._builder._38_2_ = group._builder._38_2_;
  uVar2 = corge._builder._32_8_;
  corge._builder.data = group._builder.data;
  corge._builder.pointers = group._builder.pointers;
  corge._builder.segment = group._builder.segment;
  corge._builder.capTable = group._builder.capTable;
  corge._builder.dataSize = group._builder.dataSize;
  SVar6 = corge._builder.dataSize;
  corge._builder._32_8_ = uVar2;
  if (corge._builder.dataSize < 0x180) {
    if (kj::_::Debug::minSeverity < 3) {
      uVar10 = 0;
LAB_001f9c29:
      local_1c8._0_8_ = (char *)0x31d361eb8a086;
      local_150 = uVar10;
      kj::_::Debug::log<char_const(&)[61],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x179,ERROR,
                 "\"failed: expected \" \"(876543210987654llu) == (corge.getGrault())\", 876543210987654llu, corge.getGrault()"
                 ,(char (*) [61])"failed: expected (876543210987654llu) == (corge.getGrault())",
                 (unsigned_long_long *)local_1c8,&local_150);
    }
    if (0xdf < SVar6) goto LAB_001f9c7a;
    if (2 < kj::_::Debug::minSeverity) goto LAB_001f9cce;
    sVar4 = 0;
  }
  else {
    uVar10 = *(unsigned_long *)((long)group._builder.data + 0x28);
    if ((uVar10 != 0x31d361eb8a086) && (kj::_::Debug::minSeverity < 3)) goto LAB_001f9c29;
LAB_001f9c7a:
    sVar4 = *(short *)((long)corge._builder.data + 0x1a);
    if ((sVar4 == 0x5ba0) || (2 < kj::_::Debug::minSeverity)) goto LAB_001f9cce;
  }
  local_1c8._0_4_ = 0x5ba0;
  local_150 = CONCAT62(local_150._2_6_,sVar4);
  kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_short>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x17a,ERROR,
             "\"failed: expected \" \"(23456u) == (corge.getGarply())\", 23456u, corge.getGarply()",
             (char (*) [49])"failed: expected (23456u) == (corge.getGarply())",(uint *)local_1c8,
             (unsigned_short *)&local_150);
LAB_001f9cce:
  local_1c8 = (undefined1  [16])
              capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getPlugh
                        ((Reader *)&corge);
  bVar3 = kj::operator==("hgulp",(StringPtr *)local_1c8);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    local_1c8 = (undefined1  [16])
                capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getPlugh
                          ((Reader *)&corge);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17b,ERROR,
               "\"failed: expected \" \"(\\\"hgulp\\\") == (corge.getPlugh())\", \"hgulp\", corge.getPlugh()"
               ,(char (*) [49])"failed: expected (\"hgulp\") == (corge.getPlugh())",
               (char (*) [6])"hgulp",(Reader *)local_1c8);
  }
  local_1c8 = (undefined1  [16])
              capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getXyzzy
                        ((Reader *)&corge);
  bVar3 = kj::operator==("yzzyx",(StringPtr *)local_1c8);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    local_1c8 = (undefined1  [16])
                capnproto_test::capnp::test::TestInterleavedGroups::Group2::Corge::Reader::getXyzzy
                          ((Reader *)&corge);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(\\\"yzzyx\\\") == (corge.getXyzzy())\", \"yzzyx\", corge.getXyzzy()"
               ,(char (*) [49])"failed: expected (\"yzzyx\") == (corge.getXyzzy())",
               (char (*) [6])"yzzyx",(Reader *)local_1c8);
  }
  local_1c8 = (undefined1  [16])
              capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getWaldo
                        ((Reader *)&group);
  bVar3 = kj::operator==("odlaw",(StringPtr *)local_1c8);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    local_1c8 = (undefined1  [16])
                capnproto_test::capnp::test::TestInterleavedGroups::Group2::Reader::getWaldo
                          ((Reader *)&group);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x17d,ERROR,
               "\"failed: expected \" \"(\\\"odlaw\\\") == (group.getWaldo())\", \"odlaw\", group.getWaldo()"
               ,(char (*) [49])"failed: expected (\"odlaw\") == (group.getWaldo())",
               (char (*) [6])"odlaw",(Reader *)local_1c8);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, InterleavedGroups) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestInterleavedGroups>();

  // Init both groups to different values.
  {
    auto group = root.getGroup1();
    group.setFoo(12345678u);
    group.setBar(123456789012345llu);
    auto corge = group.initCorge();
    corge.setGrault(987654321098765llu);
    corge.setGarply(12345u);
    corge.setPlugh("plugh");
    corge.setXyzzy("xyzzy");
    group.setWaldo("waldo");
  }

  {
    auto group = root.getGroup2();
    group.setFoo(23456789u);
    group.setBar(234567890123456llu);
    auto corge = group.initCorge();
    corge.setGrault(876543210987654llu);
    corge.setGarply(23456u);
    corge.setPlugh("hgulp");
    corge.setXyzzy("yzzyx");
    group.setWaldo("odlaw");
  }

  // Check group1 is still set correctly.
  {
    auto group = root.asReader().getGroup1();
    EXPECT_EQ(12345678u, group.getFoo());
    EXPECT_EQ(123456789012345llu, group.getBar());
    auto corge = group.getCorge();
    EXPECT_EQ(987654321098765llu, corge.getGrault());
    EXPECT_EQ(12345u, corge.getGarply());
    EXPECT_EQ("plugh", corge.getPlugh());
    EXPECT_EQ("xyzzy", corge.getXyzzy());
    EXPECT_EQ("waldo", group.getWaldo());
  }

  // Zero out group 1 and see if it is zero'd.
  {
    auto group = root.initGroup1().asReader();
    EXPECT_EQ(0u, group.getFoo());
    EXPECT_EQ(0u, group.getBar());
    EXPECT_EQ(test::TestInterleavedGroups::Group1::QUX, group.which());
    EXPECT_EQ(0u, group.getQux());
    EXPECT_FALSE(group.hasWaldo());
  }

  // Group 2 should not have been touched.
  {
    auto group = root.asReader().getGroup2();
    EXPECT_EQ(23456789u, group.getFoo());
    EXPECT_EQ(234567890123456llu, group.getBar());
    auto corge = group.getCorge();
    EXPECT_EQ(876543210987654llu, corge.getGrault());
    EXPECT_EQ(23456u, corge.getGarply());
    EXPECT_EQ("hgulp", corge.getPlugh());
    EXPECT_EQ("yzzyx", corge.getXyzzy());
    EXPECT_EQ("odlaw", group.getWaldo());
  }
}